

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomCustomWidgets::write(DomCustomWidgets *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomCustomWidget **ppDVar2;
  undefined4 in_register_00000034;
  long lVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QString local_50;
  long local_38;
  
  QVar4.field_0._4_4_ = in_register_00000034;
  QVar4.field_0._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"customwidgets";
    local_50.d.size = 0xd;
  }
  else {
    QString::toLower_helper(&local_50);
  }
  QVar4.m_size = (size_t)local_50.d.ptr;
  QXmlStreamWriter::writeStartElement(QVar4);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar1 = (this->m_customWidget).d.size;
  if (lVar1 != 0) {
    ppDVar2 = (this->m_customWidget).d.ptr;
    lVar3 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"customwidget";
      local_50.d.size = 0xc;
      DomCustomWidget::write(*(DomCustomWidget **)((long)ppDVar2 + lVar3),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar3 = lVar3 + 8;
    } while (lVar1 << 3 != lVar3);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomCustomWidgets::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("customwidgets") : tagName.toLower());

    for (DomCustomWidget *v : m_customWidget)
        v->write(writer, u"customwidget"_s);

    writer.writeEndElement();
}